

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitstreamDecoder.cpp
# Opt level: O2

void scan_bitstream_amiga(TrackData *trackdata)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  BitBuffer *this;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var4
  ;
  LogHelper *pLVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  uint8_t sector_nr;
  uint32_t calcsum;
  int sector_offset;
  int local_e0;
  uint32_t info;
  TrackData *local_d8;
  DataRate local_cc;
  uint32_t disksum;
  CRC16 crc;
  Data data;
  vector<unsigned_int,_std::allocator<unsigned_int>_> label;
  Track track;
  Sector sector;
  
  local_d8 = trackdata;
  this = TrackData::bitstream(trackdata);
  BitBuffer::seek(this,0);
  Track::Track(&track,0);
  track.tracklen = BitBuffer::track_bitsize(this);
  CRC16::CRC16(&crc,0xffff);
  uVar7 = 0;
  bVar8 = opt.a1sync == 0;
  while( true ) {
    bVar1 = BitBuffer::wrapped(this);
    if ((bVar1) ||
       ((iVar3 = Track::size(&track), iVar3 == 0 &&
        (iVar3 = BitBuffer::tell(this), track.tracklen < iVar3)))) break;
    bVar2 = BitBuffer::read1(this);
    uVar7 = (uint)bVar2 | uVar7 * 2;
    if ((uVar7 & (-(uint)bVar8 | 0xffdfffdf)) == 0x44894489) {
      sector_offset = BitBuffer::tell(this);
      info = 0;
      calcsum = 0;
      bVar1 = amiga_read_dwords(this,&info,1,&calcsum);
      if (bVar1) {
        sector_nr = (uint8_t)(info >> 0x10);
        if ((char)info == -1) {
          uVar6 = 0xb;
          if (this->datarate == _500K) {
            uVar6 = 0x16;
          }
          if ((((info >> 0x18 <= uVar6) && (0xffffff < info)) && ((info >> 0x10 & 0xff) < uVar6)) &&
             (uVar6 = info >> 8,
             (char)(info >> 8) ==
             (char)((char)(local_d8->cylhead).cyl * '\x02' + (char)(local_d8->cylhead).head))) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      (&label,4,(allocator_type *)&sector);
            bVar1 = amiga_read_dwords(this,label.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_start,
                                      (long)label.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)label.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 2,&calcsum)
            ;
            if (bVar1) {
              _Var4 = std::
                      __max_element<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                                (label.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 label.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish);
              if (*_Var4._M_current != 0) {
                sector.header._0_8_ =
                     CHS((local_d8->cylhead).cyl,(local_d8->cylhead).head,uVar6 & 0xff);
                Message<char_const*>(msgWarning,"%s label field is not empty",(char **)&sector);
              }
              bVar1 = amiga_read_dwords(this,&disksum,1,&calcsum);
              if ((bVar1) && ((calcsum = calcsum & 0x55555555, calcsum == 0 || (opt.idcrc != 0)))) {
                local_cc = this->datarate;
                Header::Header((Header *)&data,&local_d8->cylhead,(uint)sector_nr,2);
                Sector::Sector(&sector,local_cc,Amiga,(Header *)&data,0);
                sector.offset = BitBuffer::track_offset(this,sector_offset);
                bVar1 = amiga_read_dwords(this,&disksum,1,&calcsum);
                if (bVar1) {
                  iVar3 = Sector::size(&sector);
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                            (&data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                             (long)iVar3,(allocator_type *)&local_e0);
                  bVar1 = amiga_read_dwords(this,(uint32_t *)
                                                 data.
                                                 super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                 .
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start,
                                            (ulong)(long)((int)data.
                                                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  .
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (int)data.
                                                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  .
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2,
                                            &calcsum);
                  if (bVar1) {
                    if (opt.debug != 0) {
                      pLVar5 = util::operator<<((LogHelper *)&util::cout,
                                                (char (*) [15])"s_b_amiga (id=");
                      pLVar5 = util::operator<<(pLVar5,&sector_nr);
                      pLVar5 = util::operator<<(pLVar5,(char (*) [13])") at offset ");
                      pLVar5 = util::operator<<(pLVar5,&sector_offset);
                      pLVar5 = util::operator<<(pLVar5,(char (*) [3])0x1a93a4);
                      local_e0 = BitBuffer::track_offset(this,sector_offset);
                      pLVar5 = util::operator<<(pLVar5,&local_e0);
                      util::operator<<(pLVar5,(char (*) [3])0x1aa504);
                    }
                    Sector::add(&sector,&data,(calcsum & 0x55555555) != 0,'\0');
                    Track::add(&track,&sector);
                  }
                  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
                }
                std::vector<Data,_std::allocator<Data>_>::~vector(&sector.m_data);
              }
            }
            std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                      (&label.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
          }
        }
      }
    }
  }
  TrackData::add(local_d8,&track);
  std::vector<Sector,_std::allocator<Sector>_>::~vector(&track.m_sectors);
  return;
}

Assistant:

void scan_bitstream_amiga(TrackData& trackdata)
{
    auto& bitbuf = trackdata.bitstream();
    bitbuf.seek(0);

    Track track;
    track.tracklen = bitbuf.track_bitsize();

    CRC16 crc;
    uint32_t dword = 0;
    uint32_t sync_mask = opt.a1sync ? 0xffdfffdf : 0xffffffff;

    while (!bitbuf.wrapped())
    {
        // Give up if no headers were found in the first revolution
        if (!track.size() && bitbuf.tell() > track.tracklen)
            break;

        dword = (dword << 1) | bitbuf.read1();

        // Check for A1A1 MFM sync markers
        if ((dword & sync_mask) != 0x44894489)
            continue;

        auto sector_offset = bitbuf.tell();

        // Decode the info block from the odd and even MFM components
        uint32_t info = 0, calcsum = 0;
        if (!amiga_read_dwords(bitbuf, &info, 1, calcsum))
            continue;

        uint8_t type = info & 0xff;
        uint8_t track_nr = (info >> 8) & 0xff;
        uint8_t sector_nr = (info >> 16) & 0xff;
        uint8_t eot = (info >> 24) & 0xff;

        // Check for AmigaDOS (0xff), sector / sector end within normal range, and track number matching physical location
        auto max_sectors{ (bitbuf.datarate == DataRate::_500K) ? 22 : 11 };
        if (type != 0xff || sector_nr >= max_sectors || !eot || eot > max_sectors ||
            track_nr != static_cast<uint8_t>((trackdata.cylhead.cyl << 1) + trackdata.cylhead.head))
            continue;

        std::vector<uint32_t> label(4);
        if (!amiga_read_dwords(bitbuf, label.data(), label.size(), calcsum))
            continue;

        // Warn if the label field isn't empty
        if (*std::max_element(label.begin(), label.end()) != 0)
            Message(msgWarning, "%s label field is not empty", CHS(trackdata.cylhead.cyl, trackdata.cylhead.head, (info >> 8) & 0xff));

        // Read the header checksum, and combine with checksum so far
        uint32_t disksum;
        if (!amiga_read_dwords(bitbuf, &disksum, 1, calcsum))
            continue;

        // Mask the checksum to include only the data bits
        calcsum &= MFM_MASK;
        if (calcsum != 0 && !opt.idcrc)
            continue;

        Sector sector(bitbuf.datarate, Encoding::Amiga, Header(trackdata.cylhead, sector_nr, 2));
        sector.offset = bitbuf.track_offset(sector_offset);

        // Read the data checksum
        if (!amiga_read_dwords(bitbuf, &disksum, 1, calcsum))
            continue;

        // Read the data field
        Data data(sector.size());
        if (!amiga_read_dwords(bitbuf, reinterpret_cast<uint32_t*>(data.data()), data.size() / sizeof(uint32_t), calcsum))
            continue;

        if (opt.debug)
            util::cout << "s_b_amiga (id=" << sector_nr << ") at offset " << sector_offset << " (" << bitbuf.track_offset(sector_offset) << ")\n";

        bool bad_data = (calcsum & MFM_MASK) != 0;
        sector.add(std::move(data), bad_data, 0x00);

        track.add(std::move(sector));
    }

    trackdata.add(std::move(track));
}